

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O1

Value * __thiscall
optimization::inlineFunc::Rewriter::cast_value
          (Value *__return_storage_ptr__,Rewriter *this,Value *val)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar3;
  key_type local_14;
  
  if (val->field_0x18 == '\0') {
    pvVar3 = std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)&val->field_0x8);
    *(variant_alternative_t<0UL,_variant<int,_VarId>_> *)&__return_storage_ptr__->field_0x8 =
         *pvVar3;
    __return_storage_ptr__->field_0x18 = 0;
  }
  else {
    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)&val->field_0x8);
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                       (&this->var_cast_map,&local_14);
    mVar1 = *pmVar2;
    *(undefined ***)&__return_storage_ptr__->field_0x8 = &PTR_display_001ee058;
    *(mapped_type *)&__return_storage_ptr__->field_0x10 = mVar1;
    __return_storage_ptr__->field_0x18 = 1;
  }
  (__return_storage_ptr__->super_Displayable)._vptr_Displayable =
       (_func_int **)&PTR_display_001effc8;
  __return_storage_ptr__->shift = Lsl;
  __return_storage_ptr__->shift_amount = '\0';
  return __return_storage_ptr__;
}

Assistant:

mir::inst::Value cast_value(mir::inst::Value val) {
    if (val.index() == 0) {
      return std::get<int>(val);
    }
    return mir::inst::VarId(
        var_cast_map.at(std::get<mir::inst::VarId>(val).id));
  }